

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O2

void Diligent::PrintShaderCodeVariables
               (stringstream *ss,size_t LevelIdent,size_t IdentShift,ShaderCodeVariableDesc *pVars,
               Uint32 NumVars)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  size_t sVar4;
  size_t sVar5;
  char *pcVar6;
  ostream *poVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong local_80;
  
  if (NumVars != 0 && pVars != (ShaderCodeVariableDesc *)0x0) {
    lVar8 = 0;
    uVar9 = 0;
    uVar10 = 0;
    uVar14 = 0;
    uVar13 = 0;
    uVar1 = 0;
    local_80 = 0;
    while( true ) {
      if ((ulong)NumVars * 0x28 == lVar8) break;
      pcVar6 = *(char **)((long)&pVars->Name + lVar8);
      if (pcVar6 != (char *)0x0) {
        uVar3 = strlen(pcVar6);
        if ((int)uVar3 < (int)local_80) {
          uVar3 = local_80;
        }
        local_80 = uVar3 & 0xffffffff;
      }
      pcVar6 = *(char **)((long)&pVars->TypeName + lVar8);
      uVar11 = uVar1;
      if (pcVar6 != (char *)0x0) {
        sVar4 = strlen(pcVar6);
        uVar11 = (uint)sVar4;
        if ((int)(uint)sVar4 < (int)uVar1) {
          uVar11 = uVar1;
        }
      }
      uVar1 = uVar11;
      sVar5 = GetPrintWidth<unsigned_int>(*(uint *)((long)&pVars->ArraySize + lVar8),10);
      uVar11 = (uint)sVar5;
      if ((int)(uint)sVar5 < (int)(uint)uVar13) {
        uVar11 = (uint)uVar13;
      }
      sVar5 = GetPrintWidth<unsigned_int>(*(uint *)((long)&pVars->Offset + lVar8),10);
      uVar12 = (uint)sVar5;
      if ((int)(uint)sVar5 < (int)(uint)uVar14) {
        uVar12 = (uint)uVar14;
      }
      pcVar6 = GetShaderCodeVariableClassString((&pVars->Class)[lVar8]);
      sVar4 = strlen(pcVar6);
      uVar13 = sVar4 & 0xffffffff;
      if ((int)sVar4 < (int)uVar10) {
        uVar13 = uVar10;
      }
      uVar10 = uVar13;
      pcVar6 = GetShaderCodeBasicTypeString((&pVars->BasicType)[lVar8]);
      sVar4 = strlen(pcVar6);
      uVar2 = (uint)sVar4;
      if ((int)(uint)sVar4 < (int)(uint)uVar9) {
        uVar2 = (uint)uVar9;
      }
      lVar8 = lVar8 + 0x28;
      uVar9 = (ulong)uVar2;
      uVar14 = (ulong)uVar12;
      uVar13 = (ulong)uVar11;
    }
    for (lVar8 = 0; (ulong)NumVars * 0x28 != lVar8; lVar8 = lVar8 + 0x28) {
      *(long *)(ss + *(long *)(*(long *)(ss + 0x10) + -0x18) + 0x20) =
           (long)((int)local_80 + (int)LevelIdent);
      pcVar6 = *(char **)((long)&pVars->Name + lVar8);
      if (pcVar6 == (char *)0x0) {
        pcVar6 = "?";
      }
      poVar7 = std::operator<<((ostream *)(ss + 0x10),pcVar6);
      poVar7 = std::operator<<(poVar7,": ");
      *(ulong *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = (ulong)uVar1;
      pcVar6 = *(char **)((long)&pVars->TypeName + lVar8);
      if (pcVar6 == (char *)0x0) {
        pcVar6 = "";
      }
      poVar7 = std::operator<<(poVar7,pcVar6);
      poVar7 = std::operator<<(poVar7,' ');
      *(ulong *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = uVar10;
      pcVar6 = GetShaderCodeVariableClassString((&pVars->Class)[lVar8]);
      poVar7 = std::operator<<(poVar7,pcVar6);
      poVar7 = std::operator<<(poVar7,' ');
      *(ulong *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = uVar9;
      pcVar6 = GetShaderCodeBasicTypeString((&pVars->BasicType)[lVar8]);
      poVar7 = std::operator<<(poVar7,pcVar6);
      poVar7 = std::operator<<(poVar7,' ');
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      poVar7 = std::operator<<(poVar7,'x');
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      poVar7 = std::operator<<(poVar7," [");
      *(ulong *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = uVar13;
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      poVar7 = std::operator<<(poVar7,']');
      poVar7 = std::operator<<(poVar7," offset: ");
      *(ulong *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = uVar14;
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::endl<char,std::char_traits<char>>(poVar7);
      PrintShaderCodeVariables
                (ss,LevelIdent + IdentShift + local_80,IdentShift,
                 *(ShaderCodeVariableDesc **)((long)&pVars->pMembers + lVar8),
                 *(Uint32 *)((long)&pVars->NumMembers + lVar8));
    }
  }
  return;
}

Assistant:

static void PrintShaderCodeVariables(std::stringstream& ss, size_t LevelIdent, size_t IdentShift, const ShaderCodeVariableDesc* pVars, Uint32 NumVars)
{
    if (pVars == nullptr || NumVars == 0)
        return;

    int MaxNameLen      = 0;
    int MaxTypeLen      = 0;
    int MaxArraySizeLen = 0;
    int MaxOffsetLen    = 0;
    int MaxClassLen     = 0;
    int MaxBasicTypeLen = 0;
    for (Uint32 i = 0; i < NumVars; ++i)
    {
        const ShaderCodeVariableDesc& Var = pVars[i];
        if (Var.Name != nullptr)
            MaxNameLen = std::max(MaxNameLen, static_cast<int>(strlen(Var.Name)));
        if (Var.TypeName != nullptr)
            MaxTypeLen = std::max(MaxTypeLen, static_cast<int>(strlen(Var.TypeName)));
        MaxArraySizeLen = std::max(MaxArraySizeLen, static_cast<int>(GetPrintWidth(Var.ArraySize)));
        MaxOffsetLen    = std::max(MaxOffsetLen, static_cast<int>(GetPrintWidth(Var.Offset)));
        MaxClassLen     = std::max(MaxClassLen, static_cast<int>(strlen(GetShaderCodeVariableClassString(Var.Class))));
        MaxBasicTypeLen = std::max(MaxBasicTypeLen, static_cast<int>(strlen(GetShaderCodeBasicTypeString(Var.BasicType))));
    }

    for (Uint32 i = 0; i < NumVars; ++i)
    {
        const ShaderCodeVariableDesc& Var = pVars[i];
        ss << std::setw(static_cast<int>(LevelIdent) + MaxNameLen) << (Var.Name ? Var.Name : "?")
           << ": " << std::setw(MaxTypeLen) << (Var.TypeName ? Var.TypeName : "")
           << ' ' << std::setw(MaxClassLen) << GetShaderCodeVariableClassString(Var.Class)
           << ' ' << std::setw(MaxBasicTypeLen) << GetShaderCodeBasicTypeString(Var.BasicType)
           << ' ' << Uint32{Var.NumRows} << 'x' << Uint32{Var.NumColumns} << " [" << std::setw(MaxArraySizeLen) << Var.ArraySize << ']'
           << " offset: " << std::setw(MaxOffsetLen) << Var.Offset << std::endl;

        PrintShaderCodeVariables(ss, LevelIdent + MaxNameLen + IdentShift, IdentShift, Var.pMembers, Var.NumMembers);
    }
}